

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distinct_relation.cpp
# Opt level: O1

void __thiscall
duckdb::DistinctRelation::DistinctRelation
          (DistinctRelation *this,shared_ptr<duckdb::Relation,_true> *child_p)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Relation *pRVar3;
  vector<duckdb::ColumnDefinition,_true> dummy_columns;
  undefined1 local_48 [40];
  
  pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(child_p);
  local_48._0_8_ = (pointer)(local_48 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,anon_var_dwarf_647c332 + 9);
  Relation::Relation(&this->super_Relation,&pRVar3->context,DISTINCT_RELATION,(string *)local_48);
  if ((pointer)local_48._0_8_ != (pointer)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__DistinctRelation_019cf8e0;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48._16_8_ = (pointer)0x0;
  local_48._0_8_ = (pointer)0x0;
  local_48._8_8_ = (pointer)0x0;
  Relation::TryBindRelation
            (&this->super_Relation,(vector<duckdb::ColumnDefinition,_true> *)local_48);
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)local_48
            );
  return;
}

Assistant:

DistinctRelation::DistinctRelation(shared_ptr<Relation> child_p)
    : Relation(child_p->context, RelationType::DISTINCT_RELATION), child(std::move(child_p)) {
	D_ASSERT(child.get() != this);
	vector<ColumnDefinition> dummy_columns;
	TryBindRelation(dummy_columns);
}